

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::implements(Type *this,Type *ifaceClass)

{
  Symbol *pSVar1;
  Scope *pSVar2;
  bool bVar3;
  Type *this_00;
  Type *pTVar4;
  long lVar5;
  bool bVar6;
  
  this_00 = getCanonicalType(this);
  pTVar4 = getCanonicalType(this_00);
  if ((pTVar4->super_Symbol).kind == ClassType) {
    if (*(int *)&this_00[1].super_Symbol.nextInScope != 0) {
      Scope::elaborate((Scope *)(this_00 + 1));
    }
    pSVar1 = this_00[2].super_Symbol.nextInScope;
    bVar6 = pSVar1 != (Symbol *)0x0;
    if (bVar6) {
      pSVar2 = this_00[2].super_Symbol.parentScope;
      bVar3 = isMatching((Type *)pSVar2->compilation,ifaceClass);
      if (!bVar3) {
        lVar5 = 8;
        do {
          bVar3 = (long)pSVar1 << 3 == lVar5;
          bVar6 = !bVar3;
          if (bVar3) {
            return bVar6;
          }
          bVar3 = isMatching(*(Type **)((long)&pSVar2->compilation + lVar5),ifaceClass);
          lVar5 = lVar5 + 8;
        } while (!bVar3);
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Type::implements(const Type& ifaceClass) const {
    const Type* c = &getCanonicalType();
    if (!c->isClass())
        return false;

    for (auto iface : c->as<ClassType>().getImplementedInterfaces()) {
        if (iface->isMatching(ifaceClass))
            return true;
    }

    return false;
}